

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void spvtools::opt::anon_unknown_0::ReplaceLoadWithCompositeConstruct
               (IRContext *context,
               unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
               *loads_to_composites)

{
  Instruction *pIVar1;
  bool bVar2;
  reference pvVar3;
  DefUseManager *pDVar4;
  reference ppIVar5;
  Instruction *user;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  Instruction *local_88;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_80;
  undefined1 local_60 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> users;
  Instruction *composite_construct;
  Instruction *load;
  value_type *load_and_composite;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  *__range2;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  *loads_to_composites_local;
  IRContext *context_local;
  
  __end2 = std::
           unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
           ::begin(loads_to_composites);
  load_and_composite =
       (value_type *)
       std::
       unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
       ::end(loads_to_composites);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                       ,(_Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                         *)&load_and_composite);
    if (!bVar2) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false,_false>
             ::operator*(&__end2);
    pIVar1 = pvVar3->first;
    users.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pvVar3->second;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_60);
    pDVar4 = IRContext::get_def_use_mgr(context);
    __range3 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_60;
    local_88 = (Instruction *)
               users.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
    function<spvtools::opt::(anonymous_namespace)::ReplaceLoadWithCompositeConstruct(spvtools::opt::IRContext*,std::unordered_map<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>>const&)::__0,void>
              ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_80,
               (anon_class_16_2_5e208140 *)&__range3);
    analysis::DefUseManager::ForEachUse(pDVar4,pIVar1,&local_80);
    std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_80);
    __end3 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_60);
    user = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_60);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                  *)&user);
      if (!bVar2) break;
      ppIVar5 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end3);
      pIVar1 = *ppIVar5;
      pDVar4 = IRContext::get_def_use_mgr(context);
      analysis::DefUseManager::AnalyzeInstUse(pDVar4,pIVar1);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end3);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            local_60);
    std::__detail::
    _Node_const_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false,_false>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void ReplaceLoadWithCompositeConstruct(
    IRContext* context,
    const std::unordered_map<Instruction*, Instruction*>& loads_to_composites) {
  for (const auto& load_and_composite : loads_to_composites) {
    Instruction* load = load_and_composite.first;
    Instruction* composite_construct = load_and_composite.second;

    std::vector<Instruction*> users;
    context->get_def_use_mgr()->ForEachUse(
        load, [&users, composite_construct](Instruction* user, uint32_t index) {
          user->GetOperand(index).words[0] = composite_construct->result_id();
          users.push_back(user);
        });

    for (Instruction* user : users)
      context->get_def_use_mgr()->AnalyzeInstUse(user);
  }
}